

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
pstack::Reader::readObj<link_map>(Reader *this,Off offset,link_map *object,size_t count)

{
  Exception *this_00;
  Exception *pEVar1;
  Exception local_1d0;
  long local_30;
  size_t rc;
  size_t count_local;
  link_map *object_local;
  Off offset_local;
  Reader *this_local;
  
  if ((count != 0) &&
     (rc = count, count_local = (size_t)object, object_local = (link_map *)offset,
     offset_local = (Off)this,
     local_30 = (**(code **)(*(long *)this + 0x10))(this,offset,count * 0x28,object),
     local_30 != rc * 0x28)) {
    this_00 = (Exception *)__cxa_allocate_exception();
    memset(&local_1d0,0,0x1a0);
    Exception::Exception(&local_1d0);
    pEVar1 = Exception::operator<<(&local_1d0,(char (*) [29])"incomplete object read from ");
    pEVar1 = Exception::operator<<(pEVar1,this);
    pEVar1 = Exception::operator<<(pEVar1,(char (*) [12])" at offset ");
    pEVar1 = Exception::operator<<(pEVar1,(unsigned_long *)&object_local);
    pEVar1 = Exception::operator<<(pEVar1,(char (*) [6])0x1cf5c3);
    pEVar1 = Exception::operator<<(pEVar1,&rc);
    pEVar1 = Exception::operator<<(pEVar1,(char (*) [7])" bytes");
    Exception::Exception(this_00,pEVar1);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void
Reader::readObj(Off offset, Obj *object, size_t count) const
{
    if (count == 0)
        return;
    size_t rc = read(offset, count * sizeof *object, (char *)object);
    if (rc != count * sizeof *object)
        throw Exception() << "incomplete object read from " << *this
           << " at offset " << offset
           << " for " << count << " bytes";
}